

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

Array<capnp::word> * __thiscall
capnp::_::StructReader::canonicalize(Array<capnp::word> *__return_storage_ptr__,StructReader *this)

{
  bool bVar1;
  word *pwVar2;
  size_t sVar3;
  ArrayPtr<capnp::word> array;
  MessageSizeCounts MVar4;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar5;
  Array<capnp::word> backing;
  Fault f;
  Builder local_110;
  FlatMessageBuilder builder;
  
  MVar4 = totalSize(this);
  pwVar2 = kj::_::HeapArrayDisposer::allocate<capnp::word>(MVar4.wordCount + 1);
  sVar3 = MVar4.wordCount + 1;
  backing.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  backing.ptr = pwVar2;
  backing.size_ = sVar3;
  if (sVar3 != 0) {
    memset(pwVar2,0,sVar3 * 8);
  }
  array.size_ = sVar3;
  array.ptr = pwVar2;
  FlatMessageBuilder::FlatMessageBuilder(&builder,array);
  MessageBuilder::initRoot<capnp::AnyPointer>(&local_110,&builder.super_MessageBuilder);
  f.exception = (Exception *)local_110.builder.segment;
  PointerBuilder::setStruct((PointerBuilder *)&f,this,true);
  bVar1 = MessageBuilder::isCanonical(&builder.super_MessageBuilder);
  if (bVar1) {
    AVar5 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
    pwVar2 = (AVar5.ptr)->ptr;
    sVar3 = (AVar5.ptr)->size_;
    kj::heapArray<capnp::word>(__return_storage_ptr__,sVar3);
    if (sVar3 != 0) {
      memcpy(__return_storage_ptr__->ptr,pwVar2,sVar3 << 3);
    }
    FlatMessageBuilder::~FlatMessageBuilder(&builder);
    kj::Array<capnp::word>::~Array(&backing);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0xb83,FAILED,"builder.isCanonical()","");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

kj::Array<word> StructReader::canonicalize() {
  auto size = totalSize().wordCount + POINTER_SIZE_IN_WORDS;
  kj::Array<word> backing = kj::heapArray<word>(unbound(size / WORDS));
  WireHelpers::zeroMemory(backing.asPtr());
  FlatMessageBuilder builder(backing);
  _::PointerHelpers<AnyPointer>::getInternalBuilder(builder.initRoot<AnyPointer>()).setStruct(*this, true);
  KJ_ASSERT(builder.isCanonical());
  auto output = builder.getSegmentsForOutput()[0];
  kj::Array<word> trunc = kj::heapArray<word>(output.size());
  WireHelpers::copyMemory(trunc.begin(), output);
  return trunc;
}